

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# celtexture.cpp
# Opt level: O0

BYTE * __thiscall FCELTexture::GetColumn(FCELTexture *this,uint column,Span **spans)

{
  Span **ppSVar1;
  Span **spans_local;
  uint column_local;
  FCELTexture *this_local;
  
  if (this->m_pixels == (BYTE *)0x0) {
    MakeTexture(this);
  }
  spans_local._4_4_ = column;
  if ((this->super_FTexture).Width <= column) {
    if ((this->super_FTexture).WidthMask + 1 == (uint)(this->super_FTexture).Width) {
      spans_local._4_4_ = (this->super_FTexture).WidthMask & column;
    }
    else {
      spans_local._4_4_ = column % (uint)(this->super_FTexture).Width;
    }
  }
  if (spans != (Span **)0x0) {
    if (this->m_spans == (Span **)0x0) {
      ppSVar1 = FTexture::CreateSpans(&this->super_FTexture,this->m_pixels);
      this->m_spans = ppSVar1;
    }
    *spans = this->m_spans[spans_local._4_4_];
  }
  return this->m_pixels + spans_local._4_4_ * (this->super_FTexture).Height;
}

Assistant:

const BYTE* FCELTexture::GetColumn(unsigned int column, const Span** spans)
{
	if (m_pixels == NULL)
	{
		MakeTexture();
	}

	if (DWORD(column) >= DWORD(Width))
	{
		if (WidthMask + 1 == Width)
		{
			column &= WidthMask;
		}
		else
		{
			column %= Width;
		}
	}

	if (NULL != spans)
	{
		if (NULL == m_spans)
		{
			m_spans = CreateSpans(m_pixels);
		}

		*spans = m_spans[column];
	}

	return m_pixels + column * Height;
}